

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

void __thiscall icu_63::PluralFormat::copyObjects(PluralFormat *this,PluralFormat *other)

{
  uint in_EAX;
  int iVar1;
  undefined4 extraout_var;
  NumberFormat *pNVar2;
  undefined4 extraout_var_00;
  PluralRules *pPVar3;
  int in_ECX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  PluralFormat *__fn;
  void *in_R8;
  UErrorCode status;
  undefined1 auStack_18 [8];
  
  auStack_18._4_4_ = 0;
  auStack_18._0_4_ = in_EAX;
  __fn = other;
  if (this->numberFormat != (NumberFormat *)0x0) {
    (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  pPVar3 = (this->pluralRulesWrapper).pluralRules;
  if (pPVar3 != (PluralRules *)0x0) {
    (*(pPVar3->super_UObject)._vptr_UObject[1])();
  }
  if (other->numberFormat == (NumberFormat *)0x0) {
    __fn = (PluralFormat *)(auStack_18 + 4);
    pNVar2 = NumberFormat::createInstance(&this->locale,(UErrorCode *)__fn);
    __child_stack = extraout_RDX_00;
  }
  else {
    iVar1 = (*(other->numberFormat->super_Format).super_UObject._vptr_UObject[4])();
    pNVar2 = (NumberFormat *)CONCAT44(extraout_var,iVar1);
    __child_stack = extraout_RDX;
  }
  this->numberFormat = pNVar2;
  pPVar3 = (other->pluralRulesWrapper).pluralRules;
  if (pPVar3 == (PluralRules *)0x0) {
    pPVar3 = PluralRules::forLocale(&this->locale,(UErrorCode *)(auStack_18 + 4));
  }
  else {
    iVar1 = PluralRules::clone(pPVar3,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    pPVar3 = (PluralRules *)CONCAT44(extraout_var_00,iVar1);
  }
  (this->pluralRulesWrapper).pluralRules = pPVar3;
  return;
}

Assistant:

void
PluralFormat::copyObjects(const PluralFormat& other) {
    UErrorCode status = U_ZERO_ERROR;
    if (numberFormat != NULL) {
        delete numberFormat;
    }
    if (pluralRulesWrapper.pluralRules != NULL) {
        delete pluralRulesWrapper.pluralRules;
    }

    if (other.numberFormat == NULL) {
        numberFormat = NumberFormat::createInstance(locale, status);
    } else {
        numberFormat = (NumberFormat*)other.numberFormat->clone();
    }
    if (other.pluralRulesWrapper.pluralRules == NULL) {
        pluralRulesWrapper.pluralRules = PluralRules::forLocale(locale, status);
    } else {
        pluralRulesWrapper.pluralRules = other.pluralRulesWrapper.pluralRules->clone();
    }
}